

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

void __thiscall
ccs::CcsDomain::CcsDomain(CcsDomain *this,shared_ptr<ccs::CcsLogger> *log,bool logAccesses)

{
  _Head_base<0UL,_ccs::DagBuilder_*,_false> this_00;
  shared_ptr<ccs::CcsTracer> sStack_48;
  shared_ptr<ccs::CcsLogger> local_38;
  
  this_00._M_head_impl = (DagBuilder *)operator_new(0x28);
  local_38.super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (log->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (log->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (log->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (log->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  CcsTracer::makeLoggingTracer((CcsTracer *)&sStack_48,&local_38,logAccesses);
  DagBuilder::DagBuilder(this_00._M_head_impl,&sStack_48);
  (this->dag)._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>.
  _M_t.super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl = this_00._M_head_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_48.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

CcsDomain::CcsDomain(std::shared_ptr<CcsLogger> log, bool logAccesses) :
  dag(new DagBuilder(CcsTracer::makeLoggingTracer(
    std::move(log), logAccesses))) {}